

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
* __thiscall
Catch::ExprLhs<std::vector<unsigned_int,std::allocator<unsigned_int>>const&>::operator==
          (BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
           *__return_storage_ptr__,
          ExprLhs<std::vector<unsigned_int,std::allocator<unsigned_int>>const&> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rhs)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *lhs;
  bool comparisonResult;
  StringRef local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *rhs_local;
  ExprLhs<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  this_local = (ExprLhs<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareEqual<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                 (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this,rhs);
  lhs = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }